

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_property_float(nk_context *ctx,char *name,float min,float *val,float max,float step,
                      float inc_per_pixel)

{
  nk_property_variant local_38;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5cae,
                  "void nk_property_float(struct nk_context *, const char *, float, float *, float, float, float)"
                 );
  }
  if (name != (char *)0x0) {
    if (val != (float *)0x0) {
      if (ctx->current != (nk_window *)0x0) {
        local_38.value.f = *val;
        local_38.kind = NK_PROPERTY_FLOAT;
        local_38.min_value.f = min;
        local_38.max_value.f = max;
        local_38.step.f = step;
        nk_property(ctx,name,&local_38,inc_per_pixel,NK_FILTER_FLOAT);
        *val = (float)local_38.value.i;
      }
      return;
    }
    __assert_fail("val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5cb0,
                  "void nk_property_float(struct nk_context *, const char *, float, float *, float, float, float)"
                 );
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x5caf,
                "void nk_property_float(struct nk_context *, const char *, float, float *, float, float, float)"
               );
}

Assistant:

NK_API void
nk_property_float(struct nk_context *ctx, const char *name,
    float min, float *val, float max, float step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(val);

    if (!ctx || !ctx->current || !name || !val) return;
    variant = nk_property_variant_float(*val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_FLOAT);
    *val = variant.value.f;
}